

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_op_movl(DisasContext *s,int d_offset,int s_offset)

{
  TCGContext *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)(s->tmp2_i32 + (long)tcg_ctx),
                     (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(long)s_offset);
  tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_st_i32,(TCGArg)(s->tmp2_i32 + (long)tcg_ctx),
                     (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(long)d_offset);
  return;
}

Assistant:

static inline void gen_op_movl(DisasContext *s, int d_offset, int s_offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_ld_i32(tcg_ctx, s->tmp2_i32, tcg_ctx->cpu_env, s_offset);
    tcg_gen_st_i32(tcg_ctx, s->tmp2_i32, tcg_ctx->cpu_env, d_offset);
}